

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.cpp
# Opt level: O1

int __thiscall avilib::AviReader::open(AviReader *this,char *__file,int __oflag,...)

{
  LoggingObject *this_00;
  ifstream *piVar1;
  AVISTREAMHEADER *pAVar2;
  FOURCC *__s;
  uint32_t *puVar3;
  WORD WVar4;
  _Elt_pointer puVar5;
  undefined8 *puVar6;
  char *__nptr;
  _Map_pointer pp_Var7;
  char cVar8;
  char cVar9;
  char cVar10;
  int iVar11;
  int iVar12;
  undefined8 uVar13;
  long *plVar14;
  size_t sVar15;
  uint *puVar16;
  void *pvVar17;
  deque<avilib::AviReader::_dmlindex,std::allocator<avilib::AviReader::_dmlindex>> *pdVar18;
  mapped_type *pmVar19;
  _Elt_pointer p_Var20;
  char cVar21;
  long lVar22;
  ulong uVar23;
  char cVar24;
  char cVar25;
  uint uVar26;
  _Elt_pointer p_Var27;
  ulong uVar28;
  char cVar29;
  AVIOLDINDEX *idx;
  iterator *piVar30;
  bool bVar31;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Da_02;
  undefined4 extraout_XMM0_Da_03;
  undefined4 extraout_XMM0_Da_04;
  undefined4 extraout_XMM0_Da_05;
  undefined4 extraout_XMM0_Da_06;
  undefined4 extraout_XMM0_Da_07;
  undefined4 extraout_XMM0_Da_08;
  undefined4 extraout_XMM0_Da_09;
  undefined4 extraout_XMM0_Da_10;
  undefined4 extraout_XMM0_Da_11;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Db_03;
  undefined4 extraout_XMM0_Db_04;
  undefined4 extraout_XMM0_Db_05;
  undefined4 extraout_XMM0_Db_06;
  undefined4 extraout_XMM0_Db_07;
  undefined4 extraout_XMM0_Db_08;
  undefined4 extraout_XMM0_Db_09;
  undefined4 extraout_XMM0_Db_10;
  undefined4 extraout_XMM0_Db_11;
  uint32_t size;
  ifstream *local_438;
  _Elt_pointer local_430;
  deque<avilib::_avisuperindex_entry,_std::allocator<avilib::_avisuperindex_entry>_> entries;
  uint local_3cc;
  char tag [5];
  _Map_pointer local_3c0;
  AVISUPERINDEX_ENTRY entry;
  uint local_398;
  undefined4 uStack_394;
  undefined4 uStack_390;
  undefined4 uStack_38c;
  ulong local_380;
  int32_t stream_idx;
  DMLINDEX dml_index;
  string fcc;
  AVISUPERINDEX super_index;
  array<unsigned_int,_6UL> allowed;
  uint local_240 [2];
  char message [512];
  
  tag[0] = '\0';
  tag[1] = '\0';
  tag[2] = '\0';
  tag[3] = '\0';
  tag[4] = '\0';
  size = 0;
  this->m_useMovieOffset = false;
  this_00 = &this->super_LoggingObject;
  LoggingObject::clear_log(this_00);
  std::deque<unsigned_long,_std::allocator<unsigned_long>_>::clear(&this->m_moviOffs);
  piVar1 = &this->_f;
  std::ifstream::open((char *)piVar1,(_Ios_Openmode)__file);
  if (*(int *)(&this->field_0x78 + *(long *)(*(long *)&this->_f + -0x18)) == 0) {
    local_438 = piVar1;
    std::istream::seekg((long)piVar1,_S_beg);
    if (*(int *)(&this->field_0x78 + *(long *)(*(long *)&this->_f + -0x18)) == 0) {
      bVar31 = false;
      local_3cc = 0;
      do {
        piVar1 = local_438;
        piVar30 = &entries.
                   super__Deque_base<avilib::_avisuperindex_entry,_std::allocator<avilib::_avisuperindex_entry>_>
                   ._M_impl.super__Deque_impl_data._M_start;
        uVar13 = std::istream::tellg();
        plVar14 = (long *)std::istream::read((char *)piVar1,(long)tag);
        lVar22 = 2;
        if ((*(byte *)((long)plVar14 + *(long *)(*plVar14 + -0x18) + 0x20) & 5) != 0)
        goto LAB_00127a86;
        snprintf(message,0x200,"%s @ %llu",tag,uVar13);
        entries.
        super__Deque_base<avilib::_avisuperindex_entry,_std::allocator<avilib::_avisuperindex_entry>_>
        ._M_impl.super__Deque_impl_data._M_map = &piVar30->_M_cur;
        sVar15 = strlen(message);
        std::__cxx11::string::_M_construct<char_const*>((string *)&entries,message,message + sVar15)
        ;
        LoggingObject::log(this_00,(double)CONCAT44(extraout_XMM0_Db_01,extraout_XMM0_Da_01));
        if ((iterator *)
            entries.
            super__Deque_base<avilib::_avisuperindex_entry,_std::allocator<avilib::_avisuperindex_entry>_>
            ._M_impl.super__Deque_impl_data._M_map != piVar30) {
          operator_delete(entries.
                          super__Deque_base<avilib::_avisuperindex_entry,_std::allocator<avilib::_avisuperindex_entry>_>
                          ._M_impl.super__Deque_impl_data._M_map,
                          (ulong)((long)&(entries.
                                          super__Deque_base<avilib::_avisuperindex_entry,_std::allocator<avilib::_avisuperindex_entry>_>
                                          ._M_impl.super__Deque_impl_data._M_start._M_cur)->qwOffset
                                 + 1));
        }
        piVar1 = local_438;
        lVar22 = 3;
        if ((int)tag._0_4_ < 0x686c6d64) {
          if ((int)tag._0_4_ < 0x54465349) {
            if ((int)tag._0_4_ < 0x46464952) {
              if (tag._0_4_ == 0x20495641) goto LAB_00127a86;
              if (tag._0_4_ != 0x31786469) goto LAB_001287b5;
              std::istream::read((char *)local_438,(long)&size);
              p_Var20 = (_Elt_pointer)operator_new__((ulong)size);
              lVar22 = std::istream::read((char *)piVar1,(long)p_Var20);
              size = *(uint *)(lVar22 + 8);
              local_430 = p_Var20;
              if (size < 0x10) {
                uVar23 = (ulong)(size >> 4);
              }
              else {
                uVar28 = 0;
                do {
                  iVar11 = (int)p_Var20->qwOffset;
                  if (iVar11 != 0x20636572) {
                    fcc._M_dataplus._M_p._4_4_ = *(undefined4 *)((long)&p_Var20->qwOffset + 4);
                    fcc._M_dataplus._M_p._0_4_ = iVar11;
                    fcc._M_string_length = (size_type)p_Var20->dwSize;
                    fcc.field_2._M_allocated_capacity._0_4_ = p_Var20->dwDuration;
                    entries.
                    super__Deque_base<avilib::_avisuperindex_entry,_std::allocator<avilib::_avisuperindex_entry>_>
                    ._M_impl.super__Deque_impl_data._M_map =
                         &entries.
                          super__Deque_base<avilib::_avisuperindex_entry,_std::allocator<avilib::_avisuperindex_entry>_>
                          ._M_impl.super__Deque_impl_data._M_start._M_cur;
                    sVar15 = strlen((char *)p_Var20);
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&entries,p_Var20,
                               (char *)((long)&p_Var20->qwOffset + sVar15));
                    std::__cxx11::string::substr((ulong)&super_index,(ulong)&entries);
                    __nptr = (char *)CONCAT44(super_index.cb,super_index.fcc._);
                    iVar11 = atoi(__nptr);
                    if ((FOURCC *)__nptr != &super_index.dwChunkId) {
                      operator_delete(__nptr,super_index._16_8_ + 1);
                    }
                    entry.qwOffset = CONCAT44(entry.qwOffset._4_4_,iVar11);
                    pdVar18 = (deque<avilib::AviReader::_dmlindex,std::allocator<avilib::AviReader::_dmlindex>>
                               *)std::
                                 map<int,_std::deque<avilib::AviReader::_dmlindex,_std::allocator<avilib::AviReader::_dmlindex>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::deque<avilib::AviReader::_dmlindex,_std::allocator<avilib::AviReader::_dmlindex>_>_>_>_>
                                 ::operator[](&this->m_frameIdxs,(key_type_conflict *)&entry);
                    puVar6 = *(undefined8 **)(pdVar18 + 0x30);
                    if (puVar6 == (undefined8 *)(*(long *)(pdVar18 + 0x40) + -0x18)) {
                      std::
                      deque<avilib::AviReader::_dmlindex,std::allocator<avilib::AviReader::_dmlindex>>
                      ::_M_push_back_aux<avilib::AviReader::_dmlindex_const&>
                                (pdVar18,(_dmlindex *)&fcc);
                    }
                    else {
                      puVar6[2] = CONCAT44(fcc.field_2._M_allocated_capacity._4_4_,
                                           fcc.field_2._M_allocated_capacity._0_4_);
                      *puVar6 = fcc._M_dataplus._M_p;
                      puVar6[1] = fcc._M_string_length;
                      *(long *)(pdVar18 + 0x30) = *(long *)(pdVar18 + 0x30) + 0x18;
                    }
                    if ((iterator *)
                        entries.
                        super__Deque_base<avilib::_avisuperindex_entry,_std::allocator<avilib::_avisuperindex_entry>_>
                        ._M_impl.super__Deque_impl_data._M_map !=
                        &entries.
                         super__Deque_base<avilib::_avisuperindex_entry,_std::allocator<avilib::_avisuperindex_entry>_>
                         ._M_impl.super__Deque_impl_data._M_start) {
                      operator_delete(entries.
                                      super__Deque_base<avilib::_avisuperindex_entry,_std::allocator<avilib::_avisuperindex_entry>_>
                                      ._M_impl.super__Deque_impl_data._M_map,
                                      (ulong)((long)&(entries.
                                                  super__Deque_base<avilib::_avisuperindex_entry,_std::allocator<avilib::_avisuperindex_entry>_>
                                                  ._M_impl.super__Deque_impl_data._M_start._M_cur)->
                                                  qwOffset + 1));
                    }
                  }
                  p_Var20 = p_Var20 + 1;
                  uVar28 = uVar28 + 1;
                  uVar23 = (ulong)(size >> 4);
                } while (uVar28 < uVar23);
              }
              piVar30 = &entries.
                         super__Deque_base<avilib::_avisuperindex_entry,_std::allocator<avilib::_avisuperindex_entry>_>
                         ._M_impl.super__Deque_impl_data._M_start;
              snprintf(message,0x200,"%x AVIOLDINDEX",uVar23);
              entries.
              super__Deque_base<avilib::_avisuperindex_entry,_std::allocator<avilib::_avisuperindex_entry>_>
              ._M_impl.super__Deque_impl_data._M_map = &piVar30->_M_cur;
              sVar15 = strlen(message);
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&entries,message,message + sVar15);
              LoggingObject::log(this_00,(double)CONCAT44(extraout_XMM0_Db_08,extraout_XMM0_Da_08));
              if ((iterator *)
                  entries.
                  super__Deque_base<avilib::_avisuperindex_entry,_std::allocator<avilib::_avisuperindex_entry>_>
                  ._M_impl.super__Deque_impl_data._M_map != piVar30) {
                operator_delete(entries.
                                super__Deque_base<avilib::_avisuperindex_entry,_std::allocator<avilib::_avisuperindex_entry>_>
                                ._M_impl.super__Deque_impl_data._M_map,
                                (ulong)((long)&(entries.
                                                super__Deque_base<avilib::_avisuperindex_entry,_std::allocator<avilib::_avisuperindex_entry>_>
                                                ._M_impl.super__Deque_impl_data._M_start._M_cur)->
                                               qwOffset + 1));
              }
              operator_delete__(local_430);
            }
            else if (tag._0_4_ == 0x46464952) {
              std::istream::read((char *)local_438,(long)&size);
            }
            else {
              if (tag._0_4_ != 0x4b4e554a) {
                if (tag._0_4_ == 0x4f464e49) goto LAB_00127a86;
                goto LAB_001287b5;
              }
              std::istream::read((char *)local_438,(long)&size);
              std::istream::seekg((long)piVar1,size);
            }
          }
          else if ((int)tag._0_4_ < 0x58495641) {
            if (tag._0_4_ == 0x54465349) {
              std::istream::read((char *)local_438,(long)&size);
              std::istream::seekg((long)piVar1,size);
            }
            else {
              if (tag._0_4_ != 0x5453494c) goto LAB_001287b5;
              std::istream::read((char *)local_438,(long)&size);
            }
          }
          else {
            if (tag._0_4_ == 0x58495641) goto LAB_00127a86;
            if (tag._0_4_ == 0x66727473) {
              std::istream::read((char *)local_438,(long)&size);
              if (bVar31) {
                std::istream::read((char *)piVar1,(long)&this->m_waveformat);
                piVar1 = local_438;
                WVar4 = (this->m_waveformat).wFormatTag;
                if (WVar4 == 0x50) {
                  std::istream::seekg((long)local_438,0xffffffec);
                  std::istream::read((char *)piVar1,(long)&this->m_waveformatMpeg12);
                  std::istream::seekg((long)piVar1,size - 0x2c);
                  local_430 = (_Elt_pointer)(ulong)(this->m_waveformat).nSamplesPerSec;
                  local_380 = (ulong)(this->m_waveformatMpeg12).dwHeadBitrate;
                  snprintf(message,0x200,
                           "MPEG1WAVEFORMAT (\n  wFormatTag=0x%04x,\n  nChannels=%i,\n  nAvgBytesPerSec=%i,\n  nSamplesPerSec=%i,\n  wBitsPerSample=%i,\n  nBlockAlign=%i,\n  dwHeadBitrate=%i,\n  dwPTSHigh=%i,\n  dwPTSLow=%i,\n  fwHeadFlags=%i,\n  fwHeadLayer=%i,\n  fwHeadMode=%i,\n  fwHeadModeExt=%i,\n  wHeadEmphasis%i\n)"
                           ,(ulong)(this->m_waveformat).wFormatTag,
                           (ulong)(this->m_waveformat).nChannels,
                           (ulong)(this->m_waveformat).nAvgBytesPerSec,local_430,
                           (ulong)(this->m_waveformat).wBitsPerSample,
                           (ulong)(this->m_waveformat).nBlockAlign,local_380,
                           (ulong)(this->m_waveformatMpeg12).dwPTSHigh,
                           (ulong)(this->m_waveformatMpeg12).dwPTSLow,
                           (ulong)(this->m_waveformatMpeg12).fwHeadFlags,
                           (ulong)(this->m_waveformatMpeg12).fwHeadLayer,
                           (ulong)(this->m_waveformatMpeg12).fwHeadMode,
                           (ulong)(this->m_waveformatMpeg12).fwHeadModeExt,
                           (ulong)(this->m_waveformatMpeg12).wHeadEmphasis);
                }
                else if (WVar4 == 0x55) {
                  std::istream::seekg((long)local_438,0xffffffec);
                  std::istream::read((char *)piVar1,(long)&this->m_waveformatMP3);
                  std::istream::seekg((long)piVar1,size - 0x24);
                  local_430 = (_Elt_pointer)(ulong)(this->m_waveformat).nSamplesPerSec;
                  snprintf(message,0x200,
                           "MPEGLAYER3WAVEFORMAT (\n  wFormatTag=0x%04x,\n  nChannels=%i,\n  nAvgBytesPerSec=%i,\n  nSamplesPerSec=%i,\n  wBitsPerSample=%i,\n  nBlockAlign=%i\n  fdwFlags%i,\n  nBlockSize%i,\n  nCodecDelay%i,\n  nFramesPerBlock%i,\n  wID=%i\n)"
                           ,(ulong)(this->m_waveformat).wFormatTag,
                           (ulong)(this->m_waveformat).nChannels,
                           (ulong)(this->m_waveformat).nAvgBytesPerSec,local_430,
                           (ulong)(this->m_waveformat).wBitsPerSample,
                           (ulong)(this->m_waveformat).nBlockAlign,
                           (ulong)(this->m_waveformatMP3).fdwFlags,
                           (ulong)(this->m_waveformatMP3).nBlockSize,
                           (ulong)(this->m_waveformatMP3).nCodecDelay,
                           (ulong)(this->m_waveformatMP3).nFramesPerBlock,
                           (ulong)(this->m_waveformatMP3).wID);
                }
                else if (WVar4 == 0xfffe) {
                  std::istream::seekg((long)local_438,0xffffffec);
                  std::istream::read((char *)piVar1,(long)&this->m_waveformatExt);
                  std::istream::seekg((long)piVar1,size - 0x2c);
                  snprintf(message,0x200,
                           "WAVEFORMATEXTENSIBLE (\n  wFormatTag=0x%04x,\n  nChannels=%i,\n  nAvgBytesPerSec=%i,\n  nSamplesPerSec=%i,\n  wBitsPerSample=%i,\n  nBlockAlign=%i,\n  SubFormat=...,\n  wSamplesPerBlock=%i,\n  dwChannelMask=%i\n)"
                           ,(ulong)(this->m_waveformat).wFormatTag,
                           (ulong)(this->m_waveformat).nChannels,
                           (ulong)(this->m_waveformat).nAvgBytesPerSec,
                           (ulong)(this->m_waveformat).nSamplesPerSec,
                           (ulong)(this->m_waveformat).wBitsPerSample,
                           (ulong)(this->m_waveformat).nBlockAlign,
                           (ulong)(this->m_waveformatExt).Samples.wValidBitsPerSample,
                           (ulong)(this->m_waveformatExt).dwChannelMask);
                }
                else {
                  std::istream::seekg((long)local_438,size - 0x14);
                  snprintf(message,0x200,
                           "WAVEFORMATEX (\n  wFormatTag=0x%04x,\n  nChannels=%i,\n  nAvgBytesPerSec=%i,\n  nSamplesPerSec=%i,\n  wBitsPerSample=%i,\n  nBlockAlign=%i\n)"
                           ,(ulong)(this->m_waveformat).wFormatTag,
                           (ulong)(this->m_waveformat).nChannels,
                           (ulong)(this->m_waveformat).nAvgBytesPerSec,
                           (ulong)(this->m_waveformat).nSamplesPerSec,
                           (ulong)(this->m_waveformat).wBitsPerSample,
                           (ulong)(this->m_waveformat).nBlockAlign);
                }
                piVar30 = &entries.
                           super__Deque_base<avilib::_avisuperindex_entry,_std::allocator<avilib::_avisuperindex_entry>_>
                           ._M_impl.super__Deque_impl_data._M_start;
                entries.
                super__Deque_base<avilib::_avisuperindex_entry,_std::allocator<avilib::_avisuperindex_entry>_>
                ._M_impl.super__Deque_impl_data._M_map = &piVar30->_M_cur;
                sVar15 = strlen(message);
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&entries,message,message + sVar15);
                LoggingObject::log(this_00,(double)CONCAT44(extraout_XMM0_Db_11,extraout_XMM0_Da_11)
                                  );
                if ((iterator *)
                    entries.
                    super__Deque_base<avilib::_avisuperindex_entry,_std::allocator<avilib::_avisuperindex_entry>_>
                    ._M_impl.super__Deque_impl_data._M_map != piVar30) {
                  operator_delete(entries.
                                  super__Deque_base<avilib::_avisuperindex_entry,_std::allocator<avilib::_avisuperindex_entry>_>
                                  ._M_impl.super__Deque_impl_data._M_map,
                                  (ulong)((long)&(entries.
                                                  super__Deque_base<avilib::_avisuperindex_entry,_std::allocator<avilib::_avisuperindex_entry>_>
                                                  ._M_impl.super__Deque_impl_data._M_start._M_cur)->
                                                 qwOffset + 1));
                }
              }
              else {
                std::istream::read((char *)piVar1,(long)&this->m_bitmapInfo);
                if (0x28 < size) {
                  std::istream::seekg((long)piVar1,size - 0x28);
                }
                snprintf(message,0x200,
                         "BITMAPINFO (\n  biWidth=%i,\n  biHeight=%i,\n  biPlanes=%i,\n  biBitCount=%i,\n  biCompression=%s,\n  biSizeImage=%i,\n  biXPelsPerMeter=%i,\n  biYPelsPerMeter=%i,\n  biClrUsed=%i,\n  biClrImportant=%i,\n)"
                         ,(ulong)(uint)(this->m_bitmapInfo).biWidth,
                         (ulong)(uint)(this->m_bitmapInfo).biHeight,
                         (ulong)(this->m_bitmapInfo).biPlanes,(ulong)(this->m_bitmapInfo).biBitCount
                         ,&(this->m_bitmapInfo).biCompression,
                         (ulong)(this->m_bitmapInfo).biSizeImage,
                         (ulong)(uint)(this->m_bitmapInfo).biXPelsPerMeter,
                         (ulong)(uint)(this->m_bitmapInfo).biYPelsPerMeter,
                         (ulong)(this->m_bitmapInfo).biClrUsed,
                         (ulong)(this->m_bitmapInfo).biClrImportant);
                piVar30 = &entries.
                           super__Deque_base<avilib::_avisuperindex_entry,_std::allocator<avilib::_avisuperindex_entry>_>
                           ._M_impl.super__Deque_impl_data._M_start;
                entries.
                super__Deque_base<avilib::_avisuperindex_entry,_std::allocator<avilib::_avisuperindex_entry>_>
                ._M_impl.super__Deque_impl_data._M_map = &piVar30->_M_cur;
                sVar15 = strlen(message);
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&entries,message,message + sVar15);
                LoggingObject::log(this_00,(double)CONCAT44(extraout_XMM0_Db_09,extraout_XMM0_Da_09)
                                  );
                if ((iterator *)
                    entries.
                    super__Deque_base<avilib::_avisuperindex_entry,_std::allocator<avilib::_avisuperindex_entry>_>
                    ._M_impl.super__Deque_impl_data._M_map != piVar30) {
                  operator_delete(entries.
                                  super__Deque_base<avilib::_avisuperindex_entry,_std::allocator<avilib::_avisuperindex_entry>_>
                                  ._M_impl.super__Deque_impl_data._M_map,
                                  (ulong)((long)&(entries.
                                                  super__Deque_base<avilib::_avisuperindex_entry,_std::allocator<avilib::_avisuperindex_entry>_>
                                                  ._M_impl.super__Deque_impl_data._M_start._M_cur)->
                                                 qwOffset + 1));
                }
              }
            }
            else {
              if (tag._0_4_ != 0x68697661) goto LAB_001287b5;
              std::istream::read((char *)local_438,(long)&size);
              lVar22 = 1;
              if (size != 0x38) goto LAB_00127a86;
              (this->m_avimHeader).fcc = (FOURCC)tag._0_4_;
              (this->m_avimHeader).cb = 0x38;
              std::istream::read((char *)piVar1,(long)&(this->m_avimHeader).dwMicroSecPerFrame);
              local_430 = (_Elt_pointer)(ulong)(this->m_avimHeader).dwStreams;
              piVar30 = &entries.
                         super__Deque_base<avilib::_avisuperindex_entry,_std::allocator<avilib::_avisuperindex_entry>_>
                         ._M_impl.super__Deque_impl_data._M_start;
              snprintf(message,0x200,
                       "AVIMAINHEADER (\n  dwFlags=0x%x,\n  dwWidth=%i,\n  dwHeight=%i,\n  dwStreams=%i,\n  dwInitialFrames=%i,\n  dwMaxBytesPerSec=%i\n  dwMicroSecPerFrame=%i\n  dwPaddingGranularity=%i\n  dwSuggestedBufferSize=%i\n  dwTotalFrames=%i\n)"
                       ,(ulong)(this->m_avimHeader).dwFlags,(ulong)(this->m_avimHeader).dwWidth,
                       (ulong)(this->m_avimHeader).dwHeight,local_430,
                       (ulong)(this->m_avimHeader).dwInitialFrames,
                       (ulong)(this->m_avimHeader).dwMaxBytesPerSec,
                       (ulong)(this->m_avimHeader).dwMicroSecPerFrame,
                       (ulong)(this->m_avimHeader).dwPaddingGranularity,
                       (ulong)(this->m_avimHeader).dwSuggestedBufferSize,
                       (ulong)(this->m_avimHeader).dwTotalFrames);
              entries.
              super__Deque_base<avilib::_avisuperindex_entry,_std::allocator<avilib::_avisuperindex_entry>_>
              ._M_impl.super__Deque_impl_data._M_map = &piVar30->_M_cur;
              sVar15 = strlen(message);
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&entries,message,message + sVar15);
              LoggingObject::log(this_00,(double)CONCAT44(extraout_XMM0_Db_02,extraout_XMM0_Da_02));
              if ((iterator *)
                  entries.
                  super__Deque_base<avilib::_avisuperindex_entry,_std::allocator<avilib::_avisuperindex_entry>_>
                  ._M_impl.super__Deque_impl_data._M_map != piVar30) {
                operator_delete(entries.
                                super__Deque_base<avilib::_avisuperindex_entry,_std::allocator<avilib::_avisuperindex_entry>_>
                                ._M_impl.super__Deque_impl_data._M_map,
                                (ulong)((long)&(entries.
                                                super__Deque_base<avilib::_avisuperindex_entry,_std::allocator<avilib::_avisuperindex_entry>_>
                                                ._M_impl.super__Deque_impl_data._M_start._M_cur)->
                                               qwOffset + 1));
              }
            }
          }
        }
        else if ((int)tag._0_4_ < 0x6c726468) {
          if ((int)tag._0_4_ < 0x69766f6d) {
            if (tag._0_4_ == 0x686c6d64) {
              std::istream::read((char *)local_438,(long)&size);
              std::istream::read((char *)piVar1,(long)&this->m_odmlExt);
              std::istream::seekg((long)piVar1,size - 4);
              snprintf(message,0x200,"ODMLExtendedAVIHeader ( dwTotalFrames=%i )",
                       (ulong)(this->m_odmlExt).dwTotalFrames);
              entries.
              super__Deque_base<avilib::_avisuperindex_entry,_std::allocator<avilib::_avisuperindex_entry>_>
              ._M_impl.super__Deque_impl_data._M_map = &piVar30->_M_cur;
              sVar15 = strlen(message);
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&entries,message,message + sVar15);
              LoggingObject::log(this_00,(double)CONCAT44(extraout_XMM0_Db_07,extraout_XMM0_Da_07));
              if ((iterator *)
                  entries.
                  super__Deque_base<avilib::_avisuperindex_entry,_std::allocator<avilib::_avisuperindex_entry>_>
                  ._M_impl.super__Deque_impl_data._M_map != piVar30) {
                operator_delete(entries.
                                super__Deque_base<avilib::_avisuperindex_entry,_std::allocator<avilib::_avisuperindex_entry>_>
                                ._M_impl.super__Deque_impl_data._M_map,
                                (ulong)((long)&(entries.
                                                super__Deque_base<avilib::_avisuperindex_entry,_std::allocator<avilib::_avisuperindex_entry>_>
                                                ._M_impl.super__Deque_impl_data._M_start._M_cur)->
                                               qwOffset + 1));
              }
            }
            else {
              if (tag._0_4_ == 0x68727473) {
                lVar22 = 0;
                goto LAB_00127a86;
              }
LAB_001287b5:
              std::istream::read((char *)local_438,(long)&size);
              std::istream::seekg((long)piVar1,size);
            }
          }
          else if (tag._0_4_ == 0x69766f6d) {
            lVar22 = std::istream::tellg();
            entries.
            super__Deque_base<avilib::_avisuperindex_entry,_std::allocator<avilib::_avisuperindex_entry>_>
            ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)(lVar22 - 4);
            puVar5 = (this->m_moviOffs).
                     super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Deque_impl_data._M_finish._M_cur;
            if (puVar5 == (this->m_moviOffs).
                          super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Deque_impl_data._M_finish._M_last + -1) {
              std::deque<unsigned_long,_std::allocator<unsigned_long>_>::
              _M_push_back_aux<unsigned_long>(&this->m_moviOffs,(unsigned_long *)&entries);
            }
            else {
              *puVar5 = (unsigned_long)
                        entries.
                        super__Deque_base<avilib::_avisuperindex_entry,_std::allocator<avilib::_avisuperindex_entry>_>
                        ._M_impl.super__Deque_impl_data._M_map;
              (this->m_moviOffs).super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_cur = puVar5 + 1;
            }
            std::istream::seekg((long)local_438,size - 4);
          }
          else {
            if (tag._0_4_ != 0x6c686d64) {
              if (tag._0_4_ == 0x6c6d646f) goto LAB_00127a86;
              goto LAB_001287b5;
            }
            std::istream::read((char *)local_438,(long)&size);
            std::istream::seekg((long)piVar1,size);
          }
        }
        else if ((int)tag._0_4_ < 0x70727076) {
          if (tag._0_4_ == 0x6c726468) {
LAB_00127a86:
            iVar11 = (*(code *)((long)&DAT_0012ffc4 + (long)(int)(&DAT_0012ffc4)[lVar22]))();
            return iVar11;
          }
          if (tag._0_4_ == 0x6c727473) {
            if (1 < (int)local_3cc) {
              lVar22 = 1;
              goto LAB_00127a86;
            }
            pAVar2 = this->m_avisHeader + local_3cc;
            std::istream::read((char *)local_438,(long)pAVar2);
            bVar31 = this->m_avisHeader[local_3cc].fccType._ == 0x73647561;
            if (!bVar31) {
              this->m_videoStreamIdx = local_3cc;
            }
            cVar8 = (char)(pAVar2->fccHandler)._;
            cVar21 = (char)(pAVar2->fccType)._;
            if (cVar21 == '\0') {
              cVar21 = '?';
            }
            cVar24 = (pAVar2->fccType).fcc[1];
            if (cVar24 == '\0') {
              cVar24 = '?';
            }
            cVar25 = (pAVar2->fccType).fcc[2];
            if (cVar25 == '\0') {
              cVar25 = '?';
            }
            cVar29 = (pAVar2->fccType).fcc[3];
            if (cVar29 == '\0') {
              cVar29 = '?';
            }
            if (cVar8 == '\0') {
              cVar8 = '?';
            }
            local_430 = (_Elt_pointer)(ulong)(uint)(int)cVar8;
            cVar8 = (pAVar2->fccHandler).fcc[1];
            if (cVar8 == '\0') {
              cVar8 = '?';
            }
            cVar9 = (pAVar2->fccHandler).fcc[2];
            if ((pAVar2->fccHandler).fcc[2] == '\0') {
              cVar9 = '?';
            }
            cVar10 = (pAVar2->fccHandler).fcc[3];
            if (cVar10 == '\0') {
              cVar10 = '?';
            }
            local_380 = (ulong)(uint)(int)cVar10;
            snprintf(message,0x200,
                     "AVISTREAMHEADER (\n  fccType=%c%c%c%c,\n  fccHandler=%c%c%c%c,\n  dwFlags=%i,\n  wPriority=%i,\n  wLanguage=%i,\n  dwInitialFrames=%i\n  dwScale=%i\n  dwRate=%i\n  dwStart=%i\n  dwLength=%i\n  dwSuggestedBufferSize=%i\n  dwQuality=%i\n  dwSampleSize=%i\n  rcFrame.left=%i\n  rcFrame.top=%i\n  rcFrame.right=%i\n  rcFrame.bottom=%i\n)"
                     ,(ulong)(uint)(int)cVar21,(ulong)(uint)(int)cVar24,(ulong)(uint)(int)cVar25,
                     (ulong)(uint)(int)cVar29,local_430,(ulong)(uint)(int)cVar8,
                     (ulong)(uint)(int)cVar9,local_380,(ulong)pAVar2->dwFlags,
                     (ulong)pAVar2->wPriority,(ulong)pAVar2->wLanguage,
                     (ulong)pAVar2->dwInitialFrames,(ulong)pAVar2->dwScale,(ulong)pAVar2->dwRate,
                     (ulong)pAVar2->dwStart,(ulong)pAVar2->dwLength,
                     (ulong)pAVar2->dwSuggestedBufferSize,(ulong)pAVar2->dwQuality,
                     (ulong)pAVar2->dwSampleSize,(ulong)(uint)(int)(pAVar2->rcFrame).left,
                     (ulong)(uint)(int)(pAVar2->rcFrame).top,
                     (ulong)(uint)(int)(pAVar2->rcFrame).right,
                     (ulong)(uint)(int)(pAVar2->rcFrame).bottom);
            piVar30 = &entries.
                       super__Deque_base<avilib::_avisuperindex_entry,_std::allocator<avilib::_avisuperindex_entry>_>
                       ._M_impl.super__Deque_impl_data._M_start;
            entries.
            super__Deque_base<avilib::_avisuperindex_entry,_std::allocator<avilib::_avisuperindex_entry>_>
            ._M_impl.super__Deque_impl_data._M_map = &piVar30->_M_cur;
            sVar15 = strlen(message);
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&entries,message,message + sVar15);
            LoggingObject::log(this_00,(double)CONCAT44(extraout_XMM0_Db_10,extraout_XMM0_Da_10));
            if ((iterator *)
                entries.
                super__Deque_base<avilib::_avisuperindex_entry,_std::allocator<avilib::_avisuperindex_entry>_>
                ._M_impl.super__Deque_impl_data._M_map != piVar30) {
              operator_delete(entries.
                              super__Deque_base<avilib::_avisuperindex_entry,_std::allocator<avilib::_avisuperindex_entry>_>
                              ._M_impl.super__Deque_impl_data._M_map,
                              (ulong)((long)&(entries.
                                              super__Deque_base<avilib::_avisuperindex_entry,_std::allocator<avilib::_avisuperindex_entry>_>
                                              ._M_impl.super__Deque_impl_data._M_start._M_cur)->
                                             qwOffset + 1));
            }
            local_3cc = local_3cc + 1;
          }
          else {
            if (tag._0_4_ != 0x6e727473) goto LAB_001287b5;
            std::istream::read((char *)local_438,(long)&size);
            std::istream::seekg((long)piVar1,size - 4);
          }
        }
        else if (tag._0_4_ == 0x70727076) {
          std::istream::read((char *)local_438,(long)&size);
          std::istream::read((char *)piVar1,(long)&entries);
          pvVar17 = malloc(((ulong)entries.
                                   super__Deque_base<avilib::_avisuperindex_entry,_std::allocator<avilib::_avisuperindex_entry>_>
                                   ._M_impl.super__Deque_impl_data._M_start._M_last & 0xffffffff) <<
                           5);
          std::istream::read((char *)piVar1,(long)pvVar17);
          free(pvVar17);
        }
        else {
          if (tag._0_4_ == 0x74616454) goto LAB_00127a86;
          if (tag._0_4_ != 0x78646e69) goto LAB_001287b5;
          std::istream::read((char *)local_438,(long)&size);
          iVar11 = std::istream::tellg();
          local_380 = (ulong)size;
          super_index.fcc = (FOURCC)tag._0_4_;
          super_index.cb = size;
          std::istream::read((char *)piVar1,(long)&super_index.wLongsPerEntry);
          fcc._M_dataplus._M_p = (pointer)&fcc.field_2;
          __s = &super_index.dwChunkId;
          sVar15 = strlen(__s->fcc);
          std::__cxx11::string::_M_construct<char_const*>((string *)&fcc,__s,sVar15 + (long)__s);
          std::__cxx11::string::substr((ulong)&entries,(ulong)&fcc);
          pp_Var7 = entries.
                    super__Deque_base<avilib::_avisuperindex_entry,_std::allocator<avilib::_avisuperindex_entry>_>
                    ._M_impl.super__Deque_impl_data._M_map;
          iVar12 = atoi((char *)entries.
                                super__Deque_base<avilib::_avisuperindex_entry,_std::allocator<avilib::_avisuperindex_entry>_>
                                ._M_impl.super__Deque_impl_data._M_map);
          if ((iterator *)pp_Var7 !=
              &entries.
               super__Deque_base<avilib::_avisuperindex_entry,_std::allocator<avilib::_avisuperindex_entry>_>
               ._M_impl.super__Deque_impl_data._M_start) {
            operator_delete(pp_Var7,(ulong)((long)&(entries.
                                                  super__Deque_base<avilib::_avisuperindex_entry,_std::allocator<avilib::_avisuperindex_entry>_>
                                                  ._M_impl.super__Deque_impl_data._M_start._M_cur)->
                                                  qwOffset + 1));
          }
          stream_idx = iVar12;
          if (super_index.bIndexSubType != '\0') {
            __assert_fail("0 == super_index.bIndexSubType",
                          "/workspace/llm4binary/github/license_c_cmakelists/arionik[P]avilib/reader.cpp"
                          ,0x10a,"bool avilib::AviReader::open(const char *)");
          }
          piVar30 = &entries.
                     super__Deque_base<avilib::_avisuperindex_entry,_std::allocator<avilib::_avisuperindex_entry>_>
                     ._M_impl.super__Deque_impl_data._M_start;
          if (super_index.bIndexType != '\0') {
            entries.
            super__Deque_base<avilib::_avisuperindex_entry,_std::allocator<avilib::_avisuperindex_entry>_>
            ._M_impl.super__Deque_impl_data._M_map = &piVar30->_M_cur;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&entries,"Warning: AVI_INDEX_OF_INDEXES != super_index.bIndexType",
                       "");
            LoggingObject::log(this_00,(double)CONCAT44(extraout_XMM0_Db_03,extraout_XMM0_Da_03));
            if ((iterator *)
                entries.
                super__Deque_base<avilib::_avisuperindex_entry,_std::allocator<avilib::_avisuperindex_entry>_>
                ._M_impl.super__Deque_impl_data._M_map != piVar30) {
              operator_delete(entries.
                              super__Deque_base<avilib::_avisuperindex_entry,_std::allocator<avilib::_avisuperindex_entry>_>
                              ._M_impl.super__Deque_impl_data._M_map,
                              (ulong)((long)&(entries.
                                              super__Deque_base<avilib::_avisuperindex_entry,_std::allocator<avilib::_avisuperindex_entry>_>
                                              ._M_impl.super__Deque_impl_data._M_start._M_cur)->
                                             qwOffset + 1));
            }
          }
          entries.
          super__Deque_base<avilib::_avisuperindex_entry,_std::allocator<avilib::_avisuperindex_entry>_>
          ._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
          entries.
          super__Deque_base<avilib::_avisuperindex_entry,_std::allocator<avilib::_avisuperindex_entry>_>
          ._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
          entries.
          super__Deque_base<avilib::_avisuperindex_entry,_std::allocator<avilib::_avisuperindex_entry>_>
          ._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
          entries.
          super__Deque_base<avilib::_avisuperindex_entry,_std::allocator<avilib::_avisuperindex_entry>_>
          ._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
          entries.
          super__Deque_base<avilib::_avisuperindex_entry,_std::allocator<avilib::_avisuperindex_entry>_>
          ._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
          entries.
          super__Deque_base<avilib::_avisuperindex_entry,_std::allocator<avilib::_avisuperindex_entry>_>
          ._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
          entries.
          super__Deque_base<avilib::_avisuperindex_entry,_std::allocator<avilib::_avisuperindex_entry>_>
          ._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
          entries.
          super__Deque_base<avilib::_avisuperindex_entry,_std::allocator<avilib::_avisuperindex_entry>_>
          ._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
          entries.
          super__Deque_base<avilib::_avisuperindex_entry,_std::allocator<avilib::_avisuperindex_entry>_>
          ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
          entries.
          super__Deque_base<avilib::_avisuperindex_entry,_std::allocator<avilib::_avisuperindex_entry>_>
          ._M_impl.super__Deque_impl_data._M_map_size = 0;
          std::
          _Deque_base<avilib::_avisuperindex_entry,_std::allocator<avilib::_avisuperindex_entry>_>::
          _M_initialize_map(&entries.
                             super__Deque_base<avilib::_avisuperindex_entry,_std::allocator<avilib::_avisuperindex_entry>_>
                            ,0);
          if (super_index.nEntriesInUse != 0) {
            uVar26 = 0;
            do {
              std::istream::read((char *)local_438,(long)&entry);
              if (entries.
                  super__Deque_base<avilib::_avisuperindex_entry,_std::allocator<avilib::_avisuperindex_entry>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                  entries.
                  super__Deque_base<avilib::_avisuperindex_entry,_std::allocator<avilib::_avisuperindex_entry>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
                std::
                deque<avilib::_avisuperindex_entry,std::allocator<avilib::_avisuperindex_entry>>::
                _M_push_back_aux<avilib::_avisuperindex_entry_const&>
                          ((deque<avilib::_avisuperindex_entry,std::allocator<avilib::_avisuperindex_entry>>
                            *)&entries,&entry);
              }
              else {
                (entries.
                 super__Deque_base<avilib::_avisuperindex_entry,_std::allocator<avilib::_avisuperindex_entry>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_cur)->qwOffset = entry.qwOffset;
                (entries.
                 super__Deque_base<avilib::_avisuperindex_entry,_std::allocator<avilib::_avisuperindex_entry>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_cur)->dwSize = entry.dwSize;
                (entries.
                 super__Deque_base<avilib::_avisuperindex_entry,_std::allocator<avilib::_avisuperindex_entry>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_cur)->dwDuration = entry.dwDuration;
                entries.
                super__Deque_base<avilib::_avisuperindex_entry,_std::allocator<avilib::_avisuperindex_entry>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_cur =
                     entries.
                     super__Deque_base<avilib::_avisuperindex_entry,_std::allocator<avilib::_avisuperindex_entry>_>
                     ._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
              }
              uVar26 = uVar26 + 1;
            } while (uVar26 < super_index.nEntriesInUse);
          }
          snprintf(message,0x200,"%ux AVISUPERINDEX_ENTRY (%s)",(ulong)super_index.nEntriesInUse,
                   fcc._M_dataplus._M_p);
          entry.qwOffset = (uint64_t)&local_398;
          sVar15 = strlen(message);
          std::__cxx11::string::_M_construct<char_const*>((string *)&entry,message,message + sVar15)
          ;
          LoggingObject::log(this_00,(double)CONCAT44(extraout_XMM0_Db_04,extraout_XMM0_Da_04));
          if ((uint *)entry.qwOffset != &local_398) {
            operator_delete((void *)entry.qwOffset,CONCAT44(uStack_394,local_398) + 1);
          }
          local_430 = entries.
                      super__Deque_base<avilib::_avisuperindex_entry,_std::allocator<avilib::_avisuperindex_entry>_>
                      ._M_impl.super__Deque_impl_data._M_finish._M_cur;
          if (entries.
              super__Deque_base<avilib::_avisuperindex_entry,_std::allocator<avilib::_avisuperindex_entry>_>
              ._M_impl.super__Deque_impl_data._M_start._M_cur !=
              entries.
              super__Deque_base<avilib::_avisuperindex_entry,_std::allocator<avilib::_avisuperindex_entry>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_cur) {
            local_3c0 = entries.
                        super__Deque_base<avilib::_avisuperindex_entry,_std::allocator<avilib::_avisuperindex_entry>_>
                        ._M_impl.super__Deque_impl_data._M_start._M_node;
            p_Var27 = entries.
                      super__Deque_base<avilib::_avisuperindex_entry,_std::allocator<avilib::_avisuperindex_entry>_>
                      ._M_impl.super__Deque_impl_data._M_start._M_cur;
            p_Var20 = entries.
                      super__Deque_base<avilib::_avisuperindex_entry,_std::allocator<avilib::_avisuperindex_entry>_>
                      ._M_impl.super__Deque_impl_data._M_start._M_last;
            do {
              piVar1 = local_438;
              std::istream::seekg((long)local_438,(_Ios_Seekdir)p_Var27->qwOffset);
              local_398 = 0;
              uStack_394 = 0;
              uStack_390 = 0;
              uStack_38c = 0;
              entry.qwOffset = 0;
              entry.dwSize = 0;
              entry.dwDuration = 0;
              std::istream::read((char *)piVar1,(long)&entry);
              if (local_398 != 0x20636572) {
                allowed._M_elems[0] = 0x63643030;
                allowed._M_elems[1] = 0x62643030;
                allowed._M_elems[2] = 0x63643130;
                allowed._M_elems[3] = 0x62643130;
                allowed._M_elems[4] = 0x62773030;
                allowed._M_elems[5] = 0x62773130;
                puVar16 = std::
                          __find_if<unsigned_int*,__gnu_cxx::__ops::_Iter_equals_val<unsigned_int_const>>
                                    (&allowed,local_240,&local_398);
                if (puVar16 != local_240) {
                  puVar3 = &dml_index.u32_size;
                  if (entry.dwSize._3_1_ != '\x01') {
                    dml_index._0_8_ = puVar3;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&dml_index,
                               "Warning: AVI_INDEX_OF_CHUNKS != std_index.bIndexType","");
                    LoggingObject::log(this_00,(double)CONCAT44(extraout_XMM0_Db_05,
                                                                extraout_XMM0_Da_05));
                    if ((uint32_t *)dml_index._0_8_ != puVar3) {
                      operator_delete((void *)dml_index._0_8_,
                                      CONCAT44(dml_index._20_4_,dml_index.u32_size) + 1);
                    }
                  }
                  if (entry.dwSize._2_1_ != '\0') {
                    dml_index._0_8_ = puVar3;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&dml_index,"Warning: 0 != std_index.bIndexSubType","");
                    LoggingObject::log(this_00,(double)CONCAT44(extraout_XMM0_Db_06,
                                                                extraout_XMM0_Da_06));
                    if ((uint32_t *)dml_index._0_8_ != puVar3) {
                      operator_delete((void *)dml_index._0_8_,
                                      CONCAT44(dml_index._20_4_,dml_index.u32_size) + 1);
                    }
                  }
                  pvVar17 = operator_new__(entry.qwOffset >> 0x20);
                  std::istream::read((char *)local_438,(long)pvVar17);
                  if (entry.dwDuration != 0) {
                    lVar22 = 0;
                    do {
                      dml_index.u32_flags = 0;
                      dml_index.dwChunkId = (FOURCC)local_398;
                      dml_index.i64_offset =
                           (ulong)*(uint *)((long)pvVar17 + lVar22 * 8) +
                           CONCAT44(uStack_390,uStack_394);
                      dml_index.u32_size = *(uint *)((long)pvVar17 + lVar22 * 8 + 4) & 0x7fffffff;
                      pdVar18 = (deque<avilib::AviReader::_dmlindex,std::allocator<avilib::AviReader::_dmlindex>>
                                 *)std::
                                   map<int,_std::deque<avilib::AviReader::_dmlindex,_std::allocator<avilib::AviReader::_dmlindex>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::deque<avilib::AviReader::_dmlindex,_std::allocator<avilib::AviReader::_dmlindex>_>_>_>_>
                                   ::operator[](&this->odml_frameIdxs,&stream_idx);
                      puVar6 = *(undefined8 **)(pdVar18 + 0x30);
                      if (puVar6 == (undefined8 *)(*(long *)(pdVar18 + 0x40) + -0x18)) {
                        std::
                        deque<avilib::AviReader::_dmlindex,std::allocator<avilib::AviReader::_dmlindex>>
                        ::_M_push_back_aux<avilib::AviReader::_dmlindex_const&>(pdVar18,&dml_index);
                      }
                      else {
                        puVar6[2] = CONCAT44(dml_index._20_4_,dml_index.u32_size);
                        *puVar6 = dml_index._0_8_;
                        puVar6[1] = dml_index.i64_offset;
                        *(long *)(pdVar18 + 0x30) = *(long *)(pdVar18 + 0x30) + 0x18;
                      }
                      lVar22 = lVar22 + 1;
                    } while ((uint)lVar22 < entry.dwDuration);
                  }
                  operator_delete__(pvVar17);
                }
                std::ios::clear((int)*(undefined8 *)(*(long *)local_438 + -0x18) + (int)local_438);
              }
              p_Var27 = p_Var27 + 1;
              if (p_Var27 == p_Var20) {
                p_Var27 = local_3c0[1];
                local_3c0 = local_3c0 + 1;
                p_Var20 = p_Var27 + 0x20;
              }
            } while (p_Var27 != local_430);
          }
          pmVar19 = std::
                    map<int,_avilib::_avisuperindex_chunk,_std::less<int>,_std::allocator<std::pair<const_int,_avilib::_avisuperindex_chunk>_>_>
                    ::operator[](&this->m_superIndex,&stream_idx);
          piVar1 = local_438;
          pmVar19->dwChunkId = super_index.dwChunkId;
          pmVar19->dwReserved[0] = super_index.dwReserved[0];
          *(undefined8 *)(pmVar19->dwReserved + 1) = super_index.dwReserved._4_8_;
          pmVar19->fcc = super_index.fcc;
          pmVar19->cb = super_index.cb;
          pmVar19->wLongsPerEntry = super_index.wLongsPerEntry;
          pmVar19->bIndexSubType = super_index.bIndexSubType;
          pmVar19->bIndexType = super_index.bIndexType;
          pmVar19->nEntriesInUse = super_index.nEntriesInUse;
          std::ios::clear((int)*(undefined8 *)(*(long *)local_438 + -0x18) + (int)local_438);
          std::istream::seekg((long)piVar1,iVar11 + (int)local_380);
          std::
          _Deque_base<avilib::_avisuperindex_entry,_std::allocator<avilib::_avisuperindex_entry>_>::
          ~_Deque_base(&entries.
                        super__Deque_base<avilib::_avisuperindex_entry,_std::allocator<avilib::_avisuperindex_entry>_>
                      );
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)fcc._M_dataplus._M_p != &fcc.field_2) {
            operator_delete(fcc._M_dataplus._M_p,
                            CONCAT44(fcc.field_2._M_allocated_capacity._4_4_,
                                     fcc.field_2._M_allocated_capacity._0_4_) + 1);
          }
        }
      } while (*(int *)(&this->field_0x78 + *(long *)(*(long *)&this->_f + -0x18)) == 0);
    }
    if ((this->odml_frameIdxs)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
      std::
      _Rb_tree<int,_std::pair<const_int,_std::deque<avilib::AviReader::_dmlindex,_std::allocator<avilib::AviReader::_dmlindex>_>_>,_std::_Select1st<std::pair<const_int,_std::deque<avilib::AviReader::_dmlindex,_std::allocator<avilib::AviReader::_dmlindex>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::deque<avilib::AviReader::_dmlindex,_std::allocator<avilib::AviReader::_dmlindex>_>_>_>_>
      ::swap(&(this->m_frameIdxs)._M_t,&(this->odml_frameIdxs)._M_t);
      piVar30 = &entries.
                 super__Deque_base<avilib::_avisuperindex_entry,_std::allocator<avilib::_avisuperindex_entry>_>
                 ._M_impl.super__Deque_impl_data._M_start;
      entries.
      super__Deque_base<avilib::_avisuperindex_entry,_std::allocator<avilib::_avisuperindex_entry>_>
      ._M_impl.super__Deque_impl_data._M_map = &piVar30->_M_cur;
      std::__cxx11::string::_M_construct<char_const*>((string *)&entries,"using OpenDML index","");
      LoggingObject::log(this_00,(double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00));
      if ((iterator *)
          entries.
          super__Deque_base<avilib::_avisuperindex_entry,_std::allocator<avilib::_avisuperindex_entry>_>
          ._M_impl.super__Deque_impl_data._M_map != piVar30) {
        operator_delete(entries.
                        super__Deque_base<avilib::_avisuperindex_entry,_std::allocator<avilib::_avisuperindex_entry>_>
                        ._M_impl.super__Deque_impl_data._M_map,
                        (ulong)((long)&(entries.
                                        super__Deque_base<avilib::_avisuperindex_entry,_std::allocator<avilib::_avisuperindex_entry>_>
                                        ._M_impl.super__Deque_impl_data._M_start._M_cur)->qwOffset +
                               1));
      }
    }
    piVar1 = local_438;
    std::ios::clear((int)*(undefined8 *)(*(long *)&this->_f + -0x18) + (int)local_438);
    std::istream::seekg((long)piVar1,_S_beg);
    puVar5 = (this->m_moviOffs).super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Deque_impl_data._M_finish._M_cur;
    iVar11 = (int)CONCAT71((int7)((ulong)puVar5 >> 8),
                           puVar5 != (this->m_moviOffs).
                                     super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>
                                     ._M_impl.super__Deque_impl_data._M_start._M_cur);
  }
  else {
    piVar30 = &entries.
               super__Deque_base<avilib::_avisuperindex_entry,_std::allocator<avilib::_avisuperindex_entry>_>
               ._M_impl.super__Deque_impl_data._M_start;
    entries.
    super__Deque_base<avilib::_avisuperindex_entry,_std::allocator<avilib::_avisuperindex_entry>_>.
    _M_impl.super__Deque_impl_data._M_map = &piVar30->_M_cur;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&entries,"Cannot parse, file is bad.","");
    LoggingObject::log(this_00,(double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
    if ((iterator *)
        entries.
        super__Deque_base<avilib::_avisuperindex_entry,_std::allocator<avilib::_avisuperindex_entry>_>
        ._M_impl.super__Deque_impl_data._M_map != piVar30) {
      operator_delete(entries.
                      super__Deque_base<avilib::_avisuperindex_entry,_std::allocator<avilib::_avisuperindex_entry>_>
                      ._M_impl.super__Deque_impl_data._M_map,
                      (ulong)((long)&(entries.
                                      super__Deque_base<avilib::_avisuperindex_entry,_std::allocator<avilib::_avisuperindex_entry>_>
                                      ._M_impl.super__Deque_impl_data._M_start._M_cur)->qwOffset + 1
                             ));
    }
    iVar11 = 0;
  }
  return iVar11;
}

Assistant:

bool avilib::AviReader::open( const char *filename )
{
	char tag[ 5 ] = {0};
	uint32_t size = 0;
	bool b_audio = false;
	int32_t i_streamHeader = 0;
	m_useMovieOffset = false;
	char message[512];
	clear_log();

	m_moviOffs.clear();
	_f.open( filename, ifstream::binary );
	if( !_f.good() ){
		log( "Cannot parse, file is bad." );
		return false;
	}

	_f.seekg(0,ifstream::beg);
	for(;_f.good();)
	{
		int64_t pos = _f.tellg();
		if( !_f.read( tag, 4 ) ) break;

		snprintf( message, 512, "%s @ " LLU, tag, (uint64_t)pos );
		log( message );

		if( *(uint32_t *)tag == (uint32_t)'KNUJ' ){
			_f.read( (char *)&size, 4 );
			_f.seekg(size,ifstream::cur);
		}
		else if( *(uint32_t *)tag == (uint32_t)'FFIR' ){
			_f.read( (char *)&size, 4 );  // file size
		}
		else if( *(uint32_t *)tag == (uint32_t)' IVA' ){
			continue;
		}
		else if( *(uint32_t *)tag == (uint32_t)'XIVA' ){
			continue; // OPENDML: AVIX, further RIFF chunk(s)
		}
		else if( *(uint32_t *)tag == (uint32_t)'TSIL' ){
			_f.read( (char *)&size, 4 );  // 1st: file size
		}
		else if( *(uint32_t *)tag == (uint32_t)'lrdh' ){
			continue;
		}
		else if( *(uint32_t *)tag == (uint32_t)'hiva' ){
			_f.read( (char *)&size, 4 );  // AVIMAINHEADER
			if( size != sizeof( avilib::AVIMAINHEADER ) - 8 )
				return false;
			m_avimHeader.fcc = *(FOURCC*)tag;
			m_avimHeader.cb = size;
			_f.read( (char *)&m_avimHeader + 8, m_avimHeader.cb );
			snprintf( message, 512, "AVIMAINHEADER (\n  dwFlags=0x%x,\n  dwWidth=%i,\n  dwHeight=%i,\n  dwStreams=%i,\n  dwInitialFrames=%i,\n  dwMaxBytesPerSec=%i\n  dwMicroSecPerFrame=%i\n  dwPaddingGranularity=%i\n  dwSuggestedBufferSize=%i\n  dwTotalFrames=%i\n)",
					m_avimHeader.dwFlags, m_avimHeader.dwWidth, m_avimHeader.dwHeight, m_avimHeader.dwStreams, m_avimHeader.dwInitialFrames, m_avimHeader.dwMaxBytesPerSec, m_avimHeader.dwMicroSecPerFrame, m_avimHeader.dwPaddingGranularity, m_avimHeader.dwSuggestedBufferSize, m_avimHeader.dwTotalFrames );
			log( message );
		}
		else if( *(uint32_t *)tag == (uint32_t)'lrts' ){
			if( i_streamHeader >= 2 ) return false;
			_f.read( (char *)&m_avisHeader[i_streamHeader], sizeof(avilib::AVISTREAMHEADER) );
			b_audio = m_avisHeader[i_streamHeader].fccType._ == (uint32_t)'sdua';
			if( !b_audio )
				m_videoStreamIdx = i_streamHeader;

			snprintf( message, 512, "AVISTREAMHEADER (\n  fccType=%c%c%c%c,\n  fccHandler=%c%c%c%c,\n  dwFlags=%i,\n  wPriority=%i,\n  wLanguage=%i,\n  dwInitialFrames=%i\n  dwScale=%i\n  dwRate=%i\n  dwStart=%i\n  dwLength=%i\n  dwSuggestedBufferSize=%i\n  dwQuality=%i\n  dwSampleSize=%i\n  rcFrame.left=%i\n  rcFrame.top=%i\n  rcFrame.right=%i\n  rcFrame.bottom=%i\n)",
					m_avisHeader[i_streamHeader].fccType.fcc[0] ? m_avisHeader[i_streamHeader].fccType.fcc[0] : '?',
					m_avisHeader[i_streamHeader].fccType.fcc[1] ? m_avisHeader[i_streamHeader].fccType.fcc[1] : '?',
					m_avisHeader[i_streamHeader].fccType.fcc[2] ? m_avisHeader[i_streamHeader].fccType.fcc[2] : '?',
					m_avisHeader[i_streamHeader].fccType.fcc[3] ? m_avisHeader[i_streamHeader].fccType.fcc[3] : '?',
					m_avisHeader[i_streamHeader].fccHandler.fcc[0] ? m_avisHeader[i_streamHeader].fccHandler.fcc[0] : '?',
					m_avisHeader[i_streamHeader].fccHandler.fcc[1] ? m_avisHeader[i_streamHeader].fccHandler.fcc[1] : '?',
					m_avisHeader[i_streamHeader].fccHandler.fcc[2] ? m_avisHeader[i_streamHeader].fccHandler.fcc[2] : '?',
					m_avisHeader[i_streamHeader].fccHandler.fcc[3] ? m_avisHeader[i_streamHeader].fccHandler.fcc[3] : '?',
					m_avisHeader[i_streamHeader].dwFlags,
					m_avisHeader[i_streamHeader].wPriority,
					m_avisHeader[i_streamHeader].wLanguage,
					m_avisHeader[i_streamHeader].dwInitialFrames,
					m_avisHeader[i_streamHeader].dwScale,
					m_avisHeader[i_streamHeader].dwRate,
					m_avisHeader[i_streamHeader].dwStart,
					m_avisHeader[i_streamHeader].dwLength,
					m_avisHeader[i_streamHeader].dwSuggestedBufferSize,
					m_avisHeader[i_streamHeader].dwQuality,
					m_avisHeader[i_streamHeader].dwSampleSize,
					m_avisHeader[i_streamHeader].rcFrame.left,
					m_avisHeader[i_streamHeader].rcFrame.top,
					m_avisHeader[i_streamHeader].rcFrame.right,
					m_avisHeader[i_streamHeader].rcFrame.bottom
					);
			log( message );
			i_streamHeader++;
		}
		else if( *(uint32_t *)tag == (uint32_t)'hrts' ){
			// int z=0;
		}
		else if( *(uint32_t *)tag == (uint32_t)'frts' ){
			_f.read( (char *)&size, 4 );
			if( b_audio ){
				_f.read( (char *)&m_waveformat, std::min( size, (uint32_t)sizeof(avilib::WAVEFORMATEX) ) );
				if( m_waveformat.wFormatTag == WAVE_FORMAT_EXTENSIBLE ){
					_f.seekg(-(std::streamoff)sizeof(avilib::WAVEFORMATEX),ifstream::cur);
					_f.read( (char *)&m_waveformatExt, (uint32_t)sizeof(avilib::WAVEFORMATEXTENSIBLE) );
					_f.seekg(size-sizeof(avilib::WAVEFORMATEXTENSIBLE),ifstream::cur);
					snprintf( message, 512, "WAVEFORMATEXTENSIBLE (\n  wFormatTag=0x%04x,\n  nChannels=%i,\n  nAvgBytesPerSec=%i,\n  nSamplesPerSec=%i,\n  wBitsPerSample=%i,\n  nBlockAlign=%i,\n  SubFormat=...,\n  wSamplesPerBlock=%i,\n  dwChannelMask=%i\n)",
							m_waveformat.wFormatTag, m_waveformat.nChannels, m_waveformat.nAvgBytesPerSec,
							m_waveformat.nSamplesPerSec, m_waveformat.wBitsPerSample, m_waveformat.nBlockAlign,
							m_waveformatExt.Samples.wSamplesPerBlock, m_waveformatExt.dwChannelMask);
				} else if( m_waveformat.wFormatTag == WAVE_FORMAT_MPEG ){
					_f.seekg(-(std::streamoff)sizeof(avilib::WAVEFORMATEX),ifstream::cur);
					_f.read( (char *)&m_waveformatMpeg12, (uint32_t)sizeof(avilib::MPEG1WAVEFORMAT) );
					_f.seekg((std::streamoff)size-sizeof(avilib::MPEG1WAVEFORMAT),ifstream::cur);
					snprintf( message, 512, "MPEG1WAVEFORMAT (\n  wFormatTag=0x%04x,\n  nChannels=%i,\n  nAvgBytesPerSec=%i,\n  nSamplesPerSec=%i,\n  wBitsPerSample=%i,\n  nBlockAlign=%i,\n  dwHeadBitrate=%i,\n  dwPTSHigh=%i,\n  dwPTSLow=%i,\n  fwHeadFlags=%i,\n  fwHeadLayer=%i,\n  fwHeadMode=%i,\n  fwHeadModeExt=%i,\n  wHeadEmphasis%i\n)",
							m_waveformat.wFormatTag, m_waveformat.nChannels, m_waveformat.nAvgBytesPerSec,
							m_waveformat.nSamplesPerSec, m_waveformat.wBitsPerSample, m_waveformat.nBlockAlign,
							m_waveformatMpeg12.dwHeadBitrate, m_waveformatMpeg12.dwPTSHigh, m_waveformatMpeg12.dwPTSLow,
							m_waveformatMpeg12.fwHeadFlags, m_waveformatMpeg12.fwHeadLayer, m_waveformatMpeg12.fwHeadMode,
							m_waveformatMpeg12.fwHeadModeExt, m_waveformatMpeg12.wHeadEmphasis );
				} else if( m_waveformat.wFormatTag == WAVE_FORMAT_MPEGLAYER3 ){
					_f.seekg(-(std::streamoff)sizeof(avilib::WAVEFORMATEX),ifstream::cur);
					_f.read( (char *)&m_waveformatMP3, (uint32_t)sizeof(avilib::MPEGLAYER3WAVEFORMAT) );
					_f.seekg(size-sizeof(avilib::MPEGLAYER3WAVEFORMAT),ifstream::cur);
					snprintf( message, 512, "MPEGLAYER3WAVEFORMAT (\n  wFormatTag=0x%04x,\n  nChannels=%i,\n  nAvgBytesPerSec=%i,\n  nSamplesPerSec=%i,\n  wBitsPerSample=%i,\n  nBlockAlign=%i\n  fdwFlags%i,\n  nBlockSize%i,\n  nCodecDelay%i,\n  nFramesPerBlock%i,\n  wID=%i\n)",
							m_waveformat.wFormatTag, m_waveformat.nChannels, m_waveformat.nAvgBytesPerSec,
							m_waveformat.nSamplesPerSec, m_waveformat.wBitsPerSample, m_waveformat.nBlockAlign,
							m_waveformatMP3.fdwFlags, m_waveformatMP3.nBlockSize, m_waveformatMP3.nCodecDelay, m_waveformatMP3.nFramesPerBlock,
							m_waveformatMP3.wID);
				} else {
					_f.seekg(size-sizeof(avilib::WAVEFORMATEX),ifstream::cur);
					snprintf( message, 512, "WAVEFORMATEX (\n  wFormatTag=0x%04x,\n  nChannels=%i,\n  nAvgBytesPerSec=%i,\n  nSamplesPerSec=%i,\n  wBitsPerSample=%i,\n  nBlockAlign=%i\n)",
							m_waveformat.wFormatTag, m_waveformat.nChannels, m_waveformat.nAvgBytesPerSec,
							m_waveformat.nSamplesPerSec, m_waveformat.wBitsPerSample, m_waveformat.nBlockAlign );
				}
				log( message );
			} else {
				_f.read( (char *)&m_bitmapInfo, std::min( size, (uint32_t)sizeof(avilib::BITMAPINFO) ) );
				if( size>sizeof(avilib::BITMAPINFO) )
					_f.seekg(size-sizeof(avilib::BITMAPINFO),ifstream::cur);
				snprintf( message, 512, "BITMAPINFO (\n  biWidth=%i,\n  biHeight=%i,\n  biPlanes=%i,\n  biBitCount=%i,\n  biCompression=%s,\n  biSizeImage=%i,\n  biXPelsPerMeter=%i,\n  biYPelsPerMeter=%i,\n  biClrUsed=%i,\n  biClrImportant=%i,\n)",
						m_bitmapInfo.biWidth, m_bitmapInfo.biHeight, m_bitmapInfo.biPlanes,
						m_bitmapInfo.biBitCount, m_bitmapInfo.biCompression.fcc, m_bitmapInfo.biSizeImage,
						m_bitmapInfo.biXPelsPerMeter, m_bitmapInfo.biYPelsPerMeter,
						m_bitmapInfo.biClrUsed, m_bitmapInfo.biClrImportant);
				log( message );
			}
		}
		else if( *(uint32_t *)tag == (uint32_t)'OFNI' ){
			continue;
		}
		else if( *(uint32_t *)tag == (uint32_t)'TFSI' ){
			_f.read( (char *)&size, 4 );
			_f.seekg(size,ifstream::cur);
		}
		else if( *(uint32_t *)tag == (uint32_t)'nrts' ){
			_f.read( (char *)&size, 4 );
			_f.seekg(size-4,ifstream::cur);
		}
		else if( *(uint32_t *)tag == (uint32_t)'ivom' ){
			// the movie list, here is the data.
			m_moviOffs.push_back((size_t)_f.tellg() - 4);
			_f.seekg(size-4, ifstream::cur);
		}
		else if( *(uint32_t *)tag == (uint32_t)'1xdi' ){
			_f.read( (char *)&size, 4 );
			uint8_t *p = new uint8_t[size], *p0 = p;
			size = (uint32_t)_f.read((char *)p,size).gcount();
			for (size_t i=0; i<size/sizeof(AVIOLDINDEX); i++) {
				AVIOLDINDEX *idx = (AVIOLDINDEX *)p;
				p += sizeof(AVIOLDINDEX);
				
				if( idx->dwChunkId._ == ' cer' )
					continue;

				DMLINDEX dml_index;
				dml_index.dwChunkId = idx->dwChunkId;
				dml_index.u32_flags = idx->dwFlags;
				dml_index.i64_offset = idx->dwOffset;
				dml_index.u32_size = idx->dwSize;
				string fcc = idx->dwChunkId.fcc;
				int32_t stream_idx = atoi(fcc.substr(0,2).c_str());
				m_frameIdxs[stream_idx].push_back(dml_index);
/*
				switch(m_videoStreamIdx){
				case 0:
					if( idx->dwChunkId._ == (uint32_t)'cd00' || idx->dwChunkId._ == (uint32_t)'bd00' )//'bw10' )
						m_frameIdxs[stream_idx].push_back(dml_index);
					break;
				case 1:
					if( idx->dwChunkId._ == (uint32_t)'cd10' || idx->dwChunkId._ == (uint32_t)'bd10' )//'bw10' )
						m_frameIdxs[stream_idx].push_back(dml_index);
					break;
				}
 */
			}
			snprintf( message, 512, "%x AVIOLDINDEX", size/( uint32_t )sizeof(AVIOLDINDEX));
			log( message );
			delete [] p0;
		}
		else if( *(uint32_t *)tag == (uint32_t)'lmdo' ){
			continue;
		}
		else if( *(uint32_t *)tag == (uint32_t)'hlmd' ){
			_f.read( (char *)&size, 4 );
			_f.read((char *)&m_odmlExt, sizeof(avilib::ODMLExtendedAVIHeader));
			_f.seekg(size - sizeof(avilib::ODMLExtendedAVIHeader),ifstream::cur);
			snprintf( message, 512, "ODMLExtendedAVIHeader ( dwTotalFrames=%i )", m_odmlExt.dwTotalFrames); log( message );
		}
		else if( *(uint32_t *)tag == (uint32_t)'lhmd' ){
			_f.read( (char *)&size, 4 );
			_f.seekg(size,ifstream::cur);
		}
		else if( *(uint32_t *)tag == (uint32_t)'xdni' ){
			_f.read( (char *)&size, 4 );  // AVISUPERINDEX
			streampos superindex_end = _f.tellg() + (streampos)size;

			avilib::AVISUPERINDEX super_index;
			super_index.fcc._ = *((uint32_t *)&tag);
			super_index.cb = size;
			_f.read( (char *)&super_index + 8, sizeof(avilib::AVISUPERINDEX)-8 );

			string fcc = super_index.dwChunkId.fcc;
			int32_t stream_idx = atoi(fcc.substr(0,2).c_str());

			assert( 0 == super_index.bIndexSubType );
			if( 0 != super_index.bIndexSubType ) log( "Warning: 0 != super_index.bIndexSubType" );
			if( AVI_INDEX_OF_INDEXES != super_index.bIndexType ) log( "Warning: AVI_INDEX_OF_INDEXES != super_index.bIndexType" );
			deque<avilib::AVISUPERINDEX_ENTRY> entries;

			for( uint32_t i=0; i<super_index.nEntriesInUse; i++ )
			{
				avilib::AVISUPERINDEX_ENTRY entry;
				_f.read( (char *)&entry, sizeof(avilib::AVISUPERINDEX_ENTRY) );
				entries.push_back(entry);
			}

			snprintf( message, 512, "%ux AVISUPERINDEX_ENTRY (%s)", super_index.nEntriesInUse, fcc.c_str()); log( message );

			for( avilib::AVISUPERINDEX_ENTRY &entry : entries ){
				_f.seekg( entry.qwOffset, ifstream::beg );
				avilib::AVISTDINDEX std_index;
				memset( &std_index, 0x0, sizeof(avilib::AVISTDINDEX));
				_f.read( (char *)&std_index, sizeof(avilib::AVISTDINDEX) );

				if( std_index.dwChunkId._ == ' cer' )
					continue;

				std::array<uint32_t,6> allowed = {
					(uint32_t)'cd00', (uint32_t)'bd00', (uint32_t)'cd10', (uint32_t)'bd10',
					(uint32_t)'bw00', (uint32_t)'bw10' };

				if( std::find( allowed.begin(),allowed.end(), std_index.dwChunkId._ ) != allowed.end() ){

					// not for audio:
					if( AVI_INDEX_OF_CHUNKS != std_index.bIndexType ) log( "Warning: AVI_INDEX_OF_CHUNKS != std_index.bIndexType" );
					if( 0 != std_index.bIndexSubType ) log( "Warning: 0 != std_index.bIndexSubType" );

					//if( std_index.fcc._ == (uint32_t)'00xi' )
					{
						uint8_t *p = new uint8_t[std_index.cb], *p0 = p;
						_f.read( (char *)p, std_index.cb );
						for( uint32_t j=0; j<std_index.nEntriesInUse; j++ )
						{
							avilib::AVISTDINDEX_ENTRY *idx = (avilib::AVISTDINDEX_ENTRY *)p;
							p += sizeof(avilib::AVISTDINDEX_ENTRY);
						
							DMLINDEX dml_index;
							dml_index.dwChunkId = std_index.dwChunkId;
							dml_index.u32_flags = 0;
							dml_index.i64_offset = std_index.qwBaseOffset + idx->dwOffset;// + 4;
							dml_index.u32_size = idx->dwSize & 0x7FFFFFFF;
							if(dml_index.u32_size > m_bitmapInfo.biSizeImage){
								// int z=0;
							}

							odml_frameIdxs[stream_idx].push_back(dml_index);
						}
						delete [] p0;
					}
				}
				_f.clear();
			} // each superindex entry
			m_superIndex[stream_idx] = super_index;
			_f.clear();
			_f.seekg(superindex_end,ifstream::beg);
		}
		else if( *(uint32_t *)tag == (uint32_t)'prpv' ){
			// this does nothing and has never been tested.
			_f.read( (char *)&size, 4 );
			VIDEO_PROP_HEADER vprop_header;
			_f.read( (char *)&vprop_header, std::min((size_t)size,sizeof(VIDEO_PROP_HEADER)) );
			VIDEO_PROP_HEADER::VIDEO_FIELD_DESC *p_field_desc = (VIDEO_PROP_HEADER::VIDEO_FIELD_DESC *)malloc(sizeof(VIDEO_PROP_HEADER::VIDEO_FIELD_DESC)*vprop_header.nbFieldPerFrame);
			_f.read((char *)p_field_desc, vprop_header.nbFieldPerFrame*sizeof(VIDEO_PROP_HEADER::VIDEO_FIELD_DESC));
			free( p_field_desc );
		}
		else if( *(uint32_t *)tag == ( uint32_t )'tadT'/* Adobe Premiere Timecode */ ){
			continue;
		}
		else
		{
			_f.read( (char *)&size, 4 );
			_f.seekg(size,ifstream::cur);
			// FIXME: check size is smaller than current parent element's size
		}
	}

	if( !odml_frameIdxs.empty() ){
		m_frameIdxs.swap(odml_frameIdxs);
		log( "using OpenDML index" );
	}

	_f.clear();
	_f.seekg(0,ifstream::beg);

	if( m_moviOffs.empty() )
		return false;
	
	return true;
}